

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void QMetaObject::activate(QObject *sender,QMetaObject *m,int param_3,void **argv)

{
  int iVar1;
  
  iVar1 = QMetaObjectPrivate::signalOffset(m);
  if (qt_signal_spy_callback_set._q_value._M_b._M_p == (__base_type)0x0) {
    doActivate<false>(sender,iVar1 + param_3,argv);
    return;
  }
  doActivate<true>(sender,iVar1 + param_3,argv);
  return;
}

Assistant:

void QMetaObject::activate(QObject *sender, const QMetaObject *m, int local_signal_index,
                           void **argv)
{
    int signal_index = local_signal_index + QMetaObjectPrivate::signalOffset(m);

    if (Q_UNLIKELY(qt_signal_spy_callback_set.loadRelaxed()))
        doActivate<true>(sender, signal_index, argv);
    else
        doActivate<false>(sender, signal_index, argv);
}